

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

void celero::executor::RunExperiments(shared_ptr<celero::Benchmark> *bmark)

{
  Benchmark *this;
  size_t sVar1;
  size_t sVar2;
  shared_ptr<celero::Experiment> e;
  shared_ptr<celero::Experiment> local_50;
  _Head_base<0UL,_celero::Benchmark::Impl_*,_false> local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  this = (bmark->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this != (Benchmark *)0x0) {
    sVar1 = Benchmark::getExperimentSize(this);
    if (sVar1 != 0) {
      sVar2 = 0;
      do {
        Benchmark::getExperiment
                  ((Benchmark *)&local_40,
                   (size_t)(bmark->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr);
        if (local_40._M_head_impl == (Impl *)0x0) {
          __assert_fail("e != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/Executor.cpp"
                        ,0x119,"void celero::executor::RunExperiments(std::shared_ptr<Benchmark>)");
        }
        local_50.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_40._M_head_impl;
        local_50.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_38;
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_38->_M_use_count = local_38->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_38->_M_use_count = local_38->_M_use_count + 1;
          }
        }
        Run(&local_50);
        if (local_50.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        sVar2 = sVar2 + 1;
      } while (sVar1 != sVar2);
    }
  }
  return;
}

Assistant:

void executor::RunExperiments(std::shared_ptr<Benchmark> bmark)
{
	if(bmark == nullptr)
	{
		return;
	}

	const auto experimentSize = bmark->getExperimentSize();

	for(size_t i = 0; i < experimentSize; i++)
	{
		auto e = bmark->getExperiment(i);
		assert(e != nullptr);

		executor::Run(e);
	}
}